

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O1

int __thiscall TcpServer::addToWrite(TcpServer *this,int fd)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  int local_24 [2];
  int fd_local;
  
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < fd]) {
    if (fd <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, fd < (int)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  iVar6 = 0;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    local_24[0] = fd;
    pmVar3 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](&this->connections,local_24);
    *(byte *)&(pmVar3->event).events = (byte)(pmVar3->event).events | 4;
    (pmVar3->event).data.fd = local_24[0];
    iVar2 = epoll_ctl(this->epollFd,3,local_24[0],(epoll_event *)&pmVar3->event);
    iVar6 = 0;
    if (iVar2 == -1) {
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x19c);
      Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x19d);
      iVar6 = -1;
    }
  }
  return iVar6;
}

Assistant:

int addToWrite(int fd) {
    if (!isVaildConnection(fd)) {
      return 0;
    }
    auto &event = connections[fd].event;
    // printEvent(-1, event.events);
    event.events |= EPOLLOUT;
    event.data.fd = fd;
    if (epoll_ctl(epollFd, EPOLL_CTL_MOD, fd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      Log(logger, Logger::LOG_ERROR, errorString);
      return -1;
    }
    return 0;
  }